

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeDestroy(sqlite3_vtab *pVtab)

{
  int iVar1;
  char *zSql;
  
  zSql = sqlite3_mprintf("DROP TABLE \'%q\'.\'%q_node\';DROP TABLE \'%q\'.\'%q_rowid\';DROP TABLE \'%q\'.\'%q_parent\';"
                         ,pVtab[2].pModule);
  if (zSql == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    nodeBlobReset((Rtree *)pVtab);
    iVar1 = sqlite3_exec((sqlite3 *)pVtab[1].pModule,zSql,(sqlite3_callback)0x0,(void *)0x0,
                         (char **)0x0);
    sqlite3_free(zSql);
    if (iVar1 == 0) {
      rtreeRelease((Rtree *)pVtab);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int rtreeDestroy(sqlite3_vtab *pVtab){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc;
  char *zCreate = sqlite3_mprintf(
    "DROP TABLE '%q'.'%q_node';"
    "DROP TABLE '%q'.'%q_rowid';"
    "DROP TABLE '%q'.'%q_parent';",
    pRtree->zDb, pRtree->zName,
    pRtree->zDb, pRtree->zName,
    pRtree->zDb, pRtree->zName
  );
  if( !zCreate ){
    rc = SQLITE_NOMEM;
  }else{
    nodeBlobReset(pRtree);
    rc = sqlite3_exec(pRtree->db, zCreate, 0, 0, 0);
    sqlite3_free(zCreate);
  }
  if( rc==SQLITE_OK ){
    rtreeRelease(pRtree);
  }

  return rc;
}